

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2.h
# Opt level: O1

void ncnn::pooling2x2s2_max_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint *puVar17;
  undefined4 *puVar18;
  uint *puVar19;
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->w;
    iVar3 = top_blob->h;
    iVar4 = bottom_blob->w;
    iVar13 = (iVar4 - iVar2) * 2;
    pvVar5 = bottom_blob->data;
    sVar6 = bottom_blob->cstep;
    pvVar7 = top_blob->data;
    sVar8 = top_blob->cstep;
    sVar9 = bottom_blob->elemsize;
    sVar10 = top_blob->elemsize;
    lVar16 = 0;
    do {
      if (0 < iVar3) {
        puVar19 = (uint *)(sVar6 * sVar9 * lVar16 + (long)pvVar5);
        puVar17 = puVar19 + iVar4;
        puVar18 = (undefined4 *)(sVar8 * sVar10 * lVar16 + (long)pvVar7);
        iVar14 = 0;
        do {
          iVar15 = iVar2 + 1;
          if (0 < iVar2) {
            do {
              auVar11 = vmaxss_avx(ZEXT416(puVar19[1]),ZEXT416(*puVar19));
              auVar12 = vmaxss_avx(ZEXT416(puVar17[1]),ZEXT416(*puVar17));
              auVar11 = vmaxss_avx(auVar12,auVar11);
              *puVar18 = auVar11._0_4_;
              puVar19 = puVar19 + 2;
              puVar17 = puVar17 + 2;
              puVar18 = puVar18 + 1;
              iVar15 = iVar15 + -1;
            } while (1 < iVar15);
          }
          puVar19 = puVar19 + iVar13;
          puVar17 = puVar17 + iVar13;
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar3);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar1);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_avx(const Mat& bottom_blob, Mat& top_blob,
                                 const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const float* img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);
        int outcount = 0;
        const float* r0 = img0;
        const float* r1 = img0 + w;
#if __AVX2__
        __m256i permute_mask = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
#endif // __AVX__

        for (int i = 0; i < outh; i++)
        {
#if __AVX2__
            int nn = outw >> 2;
            int remain = outw - (nn << 2);
#else
            int remain = outw;
#endif // __AVX__

#if __AVX2__
            for (; nn > 0; nn--)
            {
                __m256 _r0 = _mm256_loadu_ps(r0);
                __m256 _r1 = _mm256_loadu_ps(r1);
                __m256 _max_r0_r1 = _mm256_max_ps(_r0, _r1);
                _max_r0_r1 = _mm256_castsi256_ps(_mm256_permutevar8x32_epi32(
                                                     _mm256_castps_si256(_max_r0_r1), permute_mask));
                __m128 _max_0 = _mm256_extractf128_ps(_max_r0_r1, 0);
                __m128 _max_1 = _mm256_extractf128_ps(_max_r0_r1, 1);
                __m128 _max = _mm_max_ps(_max_0, _max_1);
                _mm_storeu_ps(outptr, _max);
                r0 += 8;
                r1 += 8;
                outptr += 4;
                outcount += 4;
            }
#endif // __AVX__
            for (; remain > 0; remain--)
            {
                float max0 = std::max(r0[0], r0[1]);
                float max1 = std::max(r1[0], r1[1]);

                *outptr = std::max(max0, max1);

                r0 += 2;
                r1 += 2;
                outptr++;
                outcount++;
            }
            r0 += tailstep;
            r1 += tailstep;
        }
    }
}